

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(ReduceLoadSize *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  DefUseManager *this_00;
  Instruction *this_01;
  iterator iVar5;
  ConstantManager *this_02;
  TypeManager *this_03;
  Type *pTVar6;
  undefined4 extraout_var;
  Constant *this_04;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar7;
  undefined1 uVar8;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> elements_used;
  
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  uVar8 = 0;
  uVar2 = Instruction::GetSingleWordInOperand(inst,0);
  this_01 = analysis::DefUseManager::GetDef(this_00,uVar2);
  if (this_01->opcode_ == OpLoad) {
    elements_used._M_t._M_impl._0_4_ = Instruction::result_id(this_01);
    iVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->should_replace_cache_)._M_h,(key_type *)&elements_used);
    if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>._M_cur ==
        (__node_type *)0x0) {
      elements_used._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &elements_used._M_t._M_impl.super__Rb_tree_header._M_header;
      elements_used._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      elements_used._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      elements_used._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_80._8_8_ = 0;
      local_68 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp:137:44)>
                 ::_M_invoke;
      local_70 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp:137:44)>
                 ::_M_manager;
      local_80._M_unused._M_object = &elements_used;
      elements_used._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           elements_used._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar1 = analysis::DefUseManager::WhileEachUser
                        (this_00,this_01,(function<bool_(spvtools::opt::Instruction_*)> *)&local_80)
      ;
      if (local_70 != (code *)0x0) {
        (*local_70)(&local_80,&local_80,__destroy_functor);
      }
      if (bVar1) {
        uVar8 = true;
        if (this->replacement_threshold_ < 1.0) {
          this_02 = IRContext::get_constant_mgr((this->super_Pass).context_);
          this_03 = IRContext::get_type_mgr((this->super_Pass).context_);
          uVar2 = Instruction::type_id(this_01);
          pTVar6 = analysis::TypeManager::GetType(this_03,uVar2);
          if (pTVar6->kind_ == kStruct) {
            iVar3 = (*pTVar6->_vptr_Type[0x1d])(pTVar6);
            uVar4 = (uint)((ulong)(*(long *)(CONCAT44(extraout_var_01,iVar3) + 0x30) -
                                  *(long *)(CONCAT44(extraout_var_01,iVar3) + 0x28)) >> 3);
          }
          else if (pTVar6->kind_ == kArray) {
            iVar3 = (*pTVar6->_vptr_Type[0x17])(pTVar6);
            this_04 = analysis::ConstantManager::FindDeclaredConstant
                                (this_02,*(uint32_t *)(CONCAT44(extraout_var,iVar3) + 0x30));
            if (this_04 == (Constant *)0x0) {
              uVar4 = 0xffffffff;
            }
            else {
              iVar3 = (*this_04->_vptr_Constant[0xe])(this_04);
              if (CONCAT44(extraout_var_00,iVar3) == 0) {
                __assert_fail("size_const->AsIntConstant()",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                              ,0xa3,
                              "bool spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(Instruction *)"
                             );
              }
              uVar4 = analysis::Constant::GetU32(this_04);
            }
          }
          else {
            uVar4 = 1;
          }
          uVar8 = (((double)CONCAT44(0x45300000,
                                     (int)(elements_used._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count >> 0x20)) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,
                                    (int)elements_used._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count) - 4503599627370496.0)) / (double)uVar4 <
                  this->replacement_threshold_;
        }
      }
      else {
        uVar8 = false;
      }
      uVar2 = Instruction::result_id(this_01);
      local_80._0_4_ = uVar2;
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->should_replace_cache_,(key_type *)local_80._M_pod_data);
      *pmVar7 = (mapped_type)uVar8;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&elements_used._M_t);
    }
    else {
      uVar8 = *(undefined1 *)
               ((long)iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_bool>,_false>.
                      _M_cur + 0xc);
    }
  }
  return (bool)uVar8;
}

Assistant:

bool ReduceLoadSize::ShouldReplaceExtract(Instruction* inst) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* op_inst = def_use_mgr->GetDef(
      inst->GetSingleWordInOperand(kExtractCompositeIdInIdx));

  if (op_inst->opcode() != spv::Op::OpLoad) {
    return false;
  }

  auto cached_result = should_replace_cache_.find(op_inst->result_id());
  if (cached_result != should_replace_cache_.end()) {
    return cached_result->second;
  }

  bool all_elements_used = false;
  std::set<uint32_t> elements_used;

  all_elements_used =
      !def_use_mgr->WhileEachUser(op_inst, [&elements_used](Instruction* use) {
        if (use->IsCommonDebugInstr()) return true;
        if (use->opcode() != spv::Op::OpCompositeExtract ||
            use->NumInOperands() == 1) {
          return false;
        }
        elements_used.insert(use->GetSingleWordInOperand(1));
        return true;
      });

  bool should_replace = false;
  if (all_elements_used) {
    should_replace = false;
  } else if (1.0 <= replacement_threshold_) {
    should_replace = true;
  } else {
    analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Type* load_type = type_mgr->GetType(op_inst->type_id());
    uint32_t total_size = 1;
    switch (load_type->kind()) {
      case analysis::Type::kArray: {
        const analysis::Constant* size_const =
            const_mgr->FindDeclaredConstant(load_type->AsArray()->LengthId());

        if (size_const) {
          assert(size_const->AsIntConstant());
          total_size = size_const->GetU32();
        } else {
          // The size is spec constant, so it is unknown at this time.  Assume
          // it is very large.
          total_size = UINT32_MAX;
        }
      } break;
      case analysis::Type::kStruct:
        total_size = static_cast<uint32_t>(
            load_type->AsStruct()->element_types().size());
        break;
      default:
        break;
    }
    double percent_used = static_cast<double>(elements_used.size()) /
                          static_cast<double>(total_size);
    should_replace = (percent_used < replacement_threshold_);
  }

  should_replace_cache_[op_inst->result_id()] = should_replace;
  return should_replace;
}